

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O3

bool __thiscall
senjo::BackgroundCommand::ParseAndExecute(BackgroundCommand *this,char *params,Thread *thread)

{
  bool bVar1;
  int iVar2;
  Output OStack_18;
  
  if (this->engine == (ChessEngine *)0x0) {
    Output::Output(&OStack_18,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Engine not set for background command",0x25);
  }
  else {
    iVar2 = (*this->_vptr_BackgroundCommand[5])();
    if ((char)iVar2 == '\0') {
      return false;
    }
    bVar1 = Thread::Active(thread);
    if (!bVar1) {
      iVar2 = (*this->engine->_vptr_ChessEngine[8])();
      if ((char)iVar2 == '\0') {
        (*this->engine->_vptr_ChessEngine[7])();
      }
      bVar1 = Thread::Start(thread,Run,this);
      return bVar1;
    }
    Output::Output(&OStack_18,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Another background command is still active, can\'t execute",
               0x39);
  }
  Output::~Output(&OStack_18);
  return false;
}

Assistant:

bool BackgroundCommand::ParseAndExecute(const char* params, Thread& thread)
{
  if (!engine) {
    Output() << "Engine not set for background command";
    return false;
  }

  if (!Parse(params)) {
    return false;
  }

  if (thread.Active()) {
    Output() << "Another background command is still active, can't execute";
    return false;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }

  return thread.Start(BackgroundCommand::Run, this);
}